

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::Parser::~Parser(Parser *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->upcoming_detached_comments_);
  std::__cxx11::string::~string((string *)&this->upcoming_doc_comments_);
  std::__cxx11::string::~string((string *)&this->syntax_identifier_);
  return;
}

Assistant:

Parser::~Parser() = default;